

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_parse
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pubkey,uchar *input32)

{
  int iVar1;
  undefined1 local_a8 [8];
  secp256k1_fe x;
  secp256k1_ge pk;
  uchar *input32_local;
  secp256k1_xonly_pubkey *pubkey_local;
  secp256k1_context *ctx_local;
  
  if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    memset(pubkey,0,0x40);
    if (input32 == (uchar *)0x0) {
      secp256k1_callback_call(&ctx->illegal_callback,"input32 != NULL");
      ctx_local._4_4_ = 0;
    }
    else {
      iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)local_a8,input32);
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        iVar1 = secp256k1_ge_set_xo_var((secp256k1_ge *)(x.n + 4),(secp256k1_fe *)local_a8,0);
        if (iVar1 == 0) {
          ctx_local._4_4_ = 0;
        }
        else {
          iVar1 = secp256k1_ge_is_in_correct_subgroup((secp256k1_ge *)(x.n + 4));
          if (iVar1 == 0) {
            ctx_local._4_4_ = 0;
          }
          else {
            secp256k1_xonly_pubkey_save(pubkey,(secp256k1_ge *)(x.n + 4));
            ctx_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_xonly_pubkey_parse(const secp256k1_context* ctx, secp256k1_xonly_pubkey *pubkey, const unsigned char *input32) {
    secp256k1_ge pk;
    secp256k1_fe x;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input32 != NULL);

    if (!secp256k1_fe_set_b32(&x, input32)) {
        return 0;
    }
    if (!secp256k1_ge_set_xo_var(&pk, &x, 0)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&pk)) {
        return 0;
    }
    secp256k1_xonly_pubkey_save(pubkey, &pk);
    return 1;
}